

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O1

REF_STATUS ref_smooth_tet_quality_around(REF_GRID ref_grid,REF_INT node,REF_DBL *min_quality)

{
  int iVar1;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_ADJ_ITEM pRVar2;
  uint uVar3;
  REF_STATUS RVar4;
  REF_INT cell;
  ulong uVar5;
  double dVar6;
  REF_DBL quality;
  REF_INT nodes [27];
  double local_b0;
  REF_INT local_a8 [30];
  
  ref_node = ref_grid->node;
  ref_cell = ref_grid->cell[8];
  *min_quality = 1.0;
  uVar5 = 0xffffffff;
  if (-1 < node) {
    uVar5 = 0xffffffff;
    if (node < ref_cell->ref_adj->nnode) {
      uVar5 = (ulong)(uint)ref_cell->ref_adj->first[(uint)node];
    }
  }
  if ((int)uVar5 == -1) {
    *min_quality = -2.0;
    RVar4 = 5;
  }
  else {
    cell = ref_cell->ref_adj->item[(int)uVar5].ref;
    do {
      uVar3 = ref_cell_nodes(ref_cell,cell,local_a8);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0x4ec,"ref_smooth_tet_quality_around",(ulong)uVar3,"nodes");
        return uVar3;
      }
      uVar3 = ref_node_tet_quality(ref_node,local_a8,&local_b0);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0x4ee,"ref_smooth_tet_quality_around",(ulong)uVar3,"qual");
        return uVar3;
      }
      dVar6 = *min_quality;
      if (local_b0 <= *min_quality) {
        dVar6 = local_b0;
      }
      *min_quality = dVar6;
      pRVar2 = ref_cell->ref_adj->item;
      iVar1 = pRVar2[(int)uVar5].next;
      uVar5 = (ulong)iVar1;
      if (uVar5 == 0xffffffffffffffff) {
        cell = -1;
      }
      else {
        cell = pRVar2[uVar5].ref;
      }
    } while (iVar1 != -1);
    RVar4 = 0;
  }
  return RVar4;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_tet_quality_around(REF_GRID ref_grid,
                                                 REF_INT node,
                                                 REF_DBL *min_quality) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_INT item, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL none_found = REF_TRUE;
  REF_DBL quality;

  *min_quality = 1.0;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    none_found = REF_FALSE;
    RSS(ref_node_tet_quality(ref_node, nodes, &quality), "qual");
    *min_quality = MIN(*min_quality, quality);
  }

  if (none_found) {
    *min_quality = -2.0;
    return REF_NOT_FOUND;
  }

  return REF_SUCCESS;
}